

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatdesc.h
# Opt level: O0

uint32_t __thiscall FormatDescriptor::channelUpper(FormatDescriptor *this)

{
  uint uVar1;
  uint32_t uVar2;
  size_type sVar3;
  runtime_error *prVar4;
  long in_RDI;
  undefined8 in_stack_ffffffffffffffc8;
  FormatDescriptor *in_stack_ffffffffffffffd0;
  
  uVar1 = *(uint *)(in_RDI + 0x10);
  sVar3 = std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::size
                    ((vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> *)
                     (in_RDI + 0x58));
  if (uVar1 != sVar3) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"Multiple samples per channel. Call sampleUpper(uint32_t s).");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((*(byte *)(in_RDI + 0x14) & 1) == 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,"Differing size channels. Call sampleUpper(uint32_t s).");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar2 = sampleUpper(in_stack_ffffffffffffffd0,(uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20)
                     );
  return uVar2;
}

Assistant:

uint32_t channelUpper() const {
        if (extended.channelCount != samples.size()) {
            throw std::runtime_error(
                "Multiple samples per channel. Call sampleUpper(uint32_t s)."
            );
        }
        if (!extended.sameUnitAllChannels) {
            throw std::runtime_error(
                "Differing size channels. Call sampleUpper(uint32_t s)."
            );
        }
        return sampleUpper(KHR_DF_CHANNEL_RGBSDA_R);
    }